

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreciseDeltaTests.cpp
# Opt level: O1

string * agge::tests::PreciseDeltaTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,"");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"22","");
  std::operator+(&local_40,&local_60,&local_80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"PreciseDeltaTests","");
  std::operator+(in_RDI,&local_40,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

test( PositiveFractionalDeltaDoesNotOverflow )
			{
				// INIT
				precise_delta d1(98, 99 * 0x10000);
				int sum = 0;

				// ACT
				d1.multiply(256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d1.next();

				// ASSERT
				assert_is_true(98 * 256 - 1 <= sum && sum <= 98 * 256);

				// INIT
				precise_delta d2(-98, 99 * 0x10000);

				sum = 0;

				// ACT
				d2.multiply(-256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d2.next();

				// ASSERT
				assert_is_true(98 * 256 - 1 <= sum && sum <= 98 * 256);
			}